

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (vhost->protocol_vh_privs == (void **)0x0) {
    ppvVar3 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
    vhost->protocol_vh_privs = ppvVar3;
    if (ppvVar3 != (void **)0x0) goto LAB_001131d7;
LAB_00113254:
    pvVar5 = (void *)0x0;
  }
  else {
LAB_001131d7:
    uVar1 = vhost->count_protocols;
    lVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    uVar7 = 0;
    for (; (uVar8 = uVar6, uVar6 != uVar7 &&
           (uVar8 = uVar7, (lws_protocols *)((long)&vhost->protocols->name + lVar4) != prot));
        lVar4 = lVar4 + 0x38) {
      uVar7 = uVar7 + 1;
    }
    if ((uint)uVar8 == uVar1) {
      lVar4 = 0;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        iVar2 = strcmp(*(char **)((long)&vhost->protocols->name + lVar4),prot->name);
        if (iVar2 == 0) {
          uVar6 = uVar7 & 0xffffffff;
          break;
        }
        lVar4 = lVar4 + 0x38;
      }
      uVar8 = uVar6;
      if ((uint)uVar6 == uVar1) goto LAB_00113254;
    }
    pvVar5 = lws_zalloc((long)size,"vh priv");
    vhost->protocol_vh_privs[uVar8 & 0xffffffff] = pvVar5;
    pvVar5 = vhost->protocol_vh_privs[uVar8 & 0xffffffff];
  }
  return pvVar5;
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");
		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols &&
		       strcmp(vhost->protocols[n].name, prot->name))
			n++;

		if (n == vhost->count_protocols)
			return NULL;
	}

	vhost->protocol_vh_privs[n] = lws_zalloc(size, "vh priv");
	return vhost->protocol_vh_privs[n];
}